

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DepthSpecsOf.hpp
# Opt level: O1

string * __thiscall
sciplot::DepthSpecsOf<sciplot::GridSpecsBase>::repr_abi_cxx11_
          (string *__return_storage_ptr__,DepthSpecsOf<sciplot::GridSpecsBase> *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->m_depth)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->m_depth)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

auto DepthSpecsOf<DerivedSpecs>::repr() const -> std::string
{
    return m_depth;
}